

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Write(TextGenerator *this,char *data,int size)

{
  int iVar1;
  int iVar2;
  char *in_RAX;
  void *void_buffer;
  char *local_38;
  
  if ((size != 0) && (this->failed_ == false)) {
    local_38 = in_RAX;
    if (this->at_start_of_line_ == true) {
      this->at_start_of_line_ = false;
      Write(this,(this->indent_)._M_dataplus._M_p,(int)(this->indent_)._M_string_length);
      if (this->failed_ != false) {
        return;
      }
    }
    while( true ) {
      if (size <= this->buffer_size_) break;
      memcpy(this->buffer_,data,(long)this->buffer_size_);
      iVar1 = this->buffer_size_;
      iVar2 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                        (this->output_,&local_38,&this->buffer_size_);
      this->failed_ = (bool)((byte)iVar2 ^ 1);
      if ((byte)iVar2 == 0) {
        return;
      }
      size = size - iVar1;
      data = data + iVar1;
      this->buffer_ = local_38;
    }
    memcpy(this->buffer_,data,(long)size);
    this->buffer_ = this->buffer_ + size;
    this->buffer_size_ = this->buffer_size_ - size;
  }
  return;
}

Assistant:

void Write(const char* data, int size) {
    if (failed_) return;
    if (size == 0) return;

    if (at_start_of_line_) {
      // Insert an indent.
      at_start_of_line_ = false;
      Write(indent_.data(), indent_.size());
      if (failed_) return;
    }

    while (size > buffer_size_) {
      // Data exceeds space in the buffer.  Copy what we can and request a
      // new buffer.
      memcpy(buffer_, data, buffer_size_);
      data += buffer_size_;
      size -= buffer_size_;
      void* void_buffer;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memcpy(buffer_, data, size);
    buffer_ += size;
    buffer_size_ -= size;
  }